

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O2

int __thiscall
TPZFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontNonSym<float>_>::Subst_Backward
          (TPZFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontNonSym<float>_> *this,
          TPZFMatrix<float> *b)

{
  std::operator<<((ostream *)&std::cout,"Entering Backward Substitution\n");
  std::ostream::flush();
  TPZFileEqnStorage<float>::Backward
            (&this->fStorage,b,(this->fFront).super_TPZFront<float>.fDecomposeType);
  return 1;
}

Assistant:

int TPZFrontMatrix<TVar,store, front>::Subst_Backward(TPZFMatrix<TVar> *b) const {
	cout << "Entering Backward Substitution\n";
	cout.flush();
	DecomposeType dec = fFront.GetDecomposeType();
//	if(dec != ECholesky) cout << "TPZFrontMatrix::Subst_Forward non matching decomposition\n";
	fStorage.Backward(*b, dec);
	return 1;
}